

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O2

Abc_Ntk_t * Abc_NtkCreatePropertyMonitorTest(Abc_Ntk_t *p)

{
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  Abc_Ntk_t *pAVar1;
  
  p_00 = Vec_IntAlloc(100);
  p_01 = Vec_IntAlloc(100);
  Vec_IntPush(p_00,0x5a);
  Vec_IntPush(p_00,0x50);
  Vec_IntPush(p_00,100);
  Vec_IntPush(p_01,1);
  Vec_IntPush(p_01,0);
  Vec_IntPush(p_01,1);
  pAVar1 = Abc_NtkCreatePropertyMonitor(p,p_00,p_01);
  Vec_IntFree(p_00);
  Vec_IntFree(p_01);
  return pAVar1;
}

Assistant:

Abc_Ntk_t * Abc_NtkCreatePropertyMonitorTest( Abc_Ntk_t * p )
{
    Abc_Ntk_t * pNtk;
    Vec_Int_t * vNodeIds = Vec_IntAlloc( 100 );
    Vec_Int_t * vNodeValues = Vec_IntAlloc( 100 );

    // this test will only work for the network, which has nodes with internal IDs such as these
    Vec_IntPush( vNodeIds, 90 );
    Vec_IntPush( vNodeIds, 80 );
    Vec_IntPush( vNodeIds, 100 );

    Vec_IntPush( vNodeValues, 1 );
    Vec_IntPush( vNodeValues, 0 );
    Vec_IntPush( vNodeValues, 1 );

    pNtk = Abc_NtkCreatePropertyMonitor( p, vNodeIds, vNodeValues );

    Vec_IntFree( vNodeIds );
    Vec_IntFree( vNodeValues );

    return pNtk;
}